

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatZero(SUNMatrix A,int myid)

{
  uint uVar1;
  SUNMatrix A_00;
  uint in_ESI;
  sunrealtype in_RDI;
  double dVar2;
  double dVar3;
  SUNMatrix B;
  sunrealtype tol;
  double stop_time;
  double start_time;
  int failure;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  A_00 = (SUNMatrix)SUNMatClone(in_RDI);
  dVar2 = get_time();
  uVar1 = SUNMatZero(A_00);
  sync_device(A_00);
  dVar3 = get_time();
  if (uVar1 == 0) {
    iVar4 = check_matrix_entry((SUNMatrix)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               (sunrealtype)((ulong)in_ESI << 0x20));
    if (iVar4 == 0) {
      if ((print_all_ranks == 0) && (in_ESI == 0)) {
        printf("    PASSED test -- SUNMatZero \n");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ESI);
        printf("    PASSED test -- SUNMatZero \n");
      }
      if ((in_ESI == 0) && (print_time != 0)) {
        printf("    SUNMatZero Time: %22.15e \n \n",dVar3 - dVar2);
      }
      SUNMatDestroy(A_00);
      iVar4 = 0;
    }
    else {
      if ((print_all_ranks == 0) && (in_ESI == 0)) {
        printf(">>> FAILED test -- SUNMatZero check \n");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ESI);
        printf(">>> FAILED test -- SUNMatZero check \n");
      }
      if (print_time != 0) {
        printf("    SUNMatZero Time: %22.15e \n \n",dVar3 - dVar2);
      }
      SUNMatDestroy(A_00);
      iVar4 = 1;
    }
  }
  else {
    if ((print_all_ranks == 0) && (in_ESI == 0)) {
      printf(">>> FAILED test -- SUNMatZero returned %d \n",(ulong)uVar1);
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_ESI);
      printf(">>> FAILED test -- SUNMatZero returned %d \n",(ulong)uVar1);
    }
    SUNMatDestroy(A_00);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Test_SUNMatZero(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;
  SUNMatrix B;

  /* protect A */
  B = SUNMatClone(A);

  /* set matrix data to zero */
  start_time = get_time();
  failure    = SUNMatZero(B);
  sync_device(B);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatZero returned %d \n", failure, myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* A data should be a vector of zeros */
  failure = check_matrix_entry(B, ZERO, tol);

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatZero check \n", myid);
    PRINT_TIME("    SUNMatZero Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatZero \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatZero Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return (0);
}